

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  double *pdVar11;
  uint uVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  int iVar16;
  double *pdVar17;
  double *pdVar18;
  ulong uVar19;
  double *pdVar20;
  ulong uVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar26 [16];
  undefined1 auVar25 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  double dVar29;
  undefined1 auVar30 [32];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int local_b4;
  long local_b0;
  double *local_a8;
  double *local_a0;
  double *local_88;
  double *local_80;
  
  iVar3 = this->kCategoryCount;
  if (0 < (long)iVar3) {
    uVar4 = this->kStateCount;
    uVar10 = uVar4 + 3;
    if (-1 < (int)uVar4) {
      uVar10 = uVar4;
    }
    uVar12 = uVar4 + 1;
    iVar5 = this->kPartialsPaddedStateCount;
    iVar6 = this->kPatternCount;
    iVar7 = this->kMatrixSize;
    local_b4 = iVar5 * startPattern;
    local_80 = matrices2 + 2;
    local_88 = matrices1 + 2;
    local_b0 = 0;
    local_a8 = matrices1;
    local_a0 = matrices2;
    do {
      if (startPattern < endPattern) {
        pdVar20 = partials2 + local_b4;
        pdVar11 = partials1 + local_b4;
        pdVar15 = destP + (iVar6 * (int)local_b0 + startPattern) * iVar5;
        iVar16 = startPattern;
        do {
          if (0 < (int)uVar4) {
            uVar21 = 0;
            pdVar13 = local_a8;
            pdVar14 = local_80;
            pdVar17 = local_88;
            pdVar18 = local_a0;
            do {
              auVar25 = ZEXT864(0) << 0x40;
              auVar24 = ZEXT832(0) << 0x40;
              uVar19 = 0;
              if (3 < (int)uVar4) {
                do {
                  auVar27._16_16_ = *(undefined1 (*) [16])(pdVar14 + (uVar19 - 2));
                  auVar27._0_16_ = *(undefined1 (*) [16])(pdVar17 + (uVar19 - 2));
                  auVar30._16_16_ = *(undefined1 (*) [16])(pdVar20 + uVar19);
                  auVar30._0_16_ = *(undefined1 (*) [16])(pdVar11 + uVar19);
                  auVar23 = vfmadd213pd_fma(auVar30,auVar27,auVar25._0_32_);
                  auVar28._16_16_ = *(undefined1 (*) [16])(pdVar14 + uVar19);
                  auVar28._0_16_ = *(undefined1 (*) [16])(pdVar17 + uVar19);
                  auVar24._16_16_ = *(undefined1 (*) [16])(pdVar20 + uVar19 + 2);
                  auVar24._0_16_ = *(undefined1 (*) [16])(pdVar11 + uVar19 + 2);
                  auVar23 = vfmadd213pd_fma(auVar24,auVar28,ZEXT1632(auVar23));
                  auVar25 = ZEXT1664(auVar23);
                  auVar24 = ZEXT1632(auVar23);
                  uVar19 = uVar19 + 4;
                } while ((long)uVar19 < (long)(int)(uVar10 & 0xfffffffc));
              }
              auVar23 = auVar24._0_16_;
              dVar29 = auVar24._0_8_;
              auVar26 = auVar24._16_16_;
              dVar31 = auVar24._16_8_;
              if ((int)uVar19 < (int)uVar4) {
                uVar19 = uVar19 & 0xffffffff;
                lVar22 = 0;
                auVar8 = auVar23;
                auVar9 = auVar26;
                do {
                  auVar32._8_8_ = 0;
                  auVar32._0_8_ = pdVar13[uVar19 + lVar22];
                  auVar1._8_8_ = 0;
                  auVar1._0_8_ = pdVar11[uVar19 + lVar22];
                  auVar8 = vfmadd231sd_fma(auVar8,auVar32,auVar1);
                  dVar29 = auVar8._0_8_;
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = pdVar18[uVar19 + lVar22];
                  auVar2._8_8_ = 0;
                  auVar2._0_8_ = pdVar20[uVar19 + lVar22];
                  auVar9 = vfmadd231sd_fma(auVar9,auVar33,auVar2);
                  dVar31 = auVar9._0_8_;
                  lVar22 = lVar22 + 1;
                } while (uVar4 - uVar19 != lVar22);
              }
              auVar23 = vshufpd_avx(auVar23,auVar23,1);
              auVar26 = vshufpd_avx(auVar26,auVar26,1);
              *pdVar15 = (auVar23._0_8_ + dVar29) * (auVar26._0_8_ + dVar31);
              pdVar15 = pdVar15 + 1;
              uVar21 = uVar21 + 1;
              pdVar14 = pdVar14 + uVar12;
              pdVar17 = pdVar17 + uVar12;
              pdVar18 = pdVar18 + uVar12;
              pdVar13 = pdVar13 + uVar12;
            } while (uVar21 != uVar4);
          }
          iVar16 = iVar16 + 1;
          pdVar20 = pdVar20 + iVar5;
          pdVar11 = pdVar11 + iVar5;
        } while (iVar16 != endPattern);
      }
      local_b0 = local_b0 + 1;
      local_b4 = local_b4 + iVar6 * iVar5;
      local_80 = local_80 + iVar7;
      local_88 = local_88 + iVar7;
      local_a0 = local_a0 + iVar7;
      local_a8 = local_a8 + iVar7;
    } while (local_b0 != iVar3);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                             const REALTYPE* partials1,
                                                             const REALTYPE* matrices1,
                                                             const REALTYPE* partials2,
                                                             const REALTYPE* matrices2,
                                                             int startPattern,
                                                             int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {

            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B);
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}